

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siphash.cpp
# Opt level: O0

uint64_t __thiscall CSipHasher::Finalize(CSipHasher *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong __x;
  ulong uVar5;
  _If_is_unsigned_integer<unsigned_long> _Var6;
  _If_is_unsigned_integer<unsigned_long> _Var7;
  _If_is_unsigned_integer<unsigned_long> _Var8;
  ulong uVar9;
  _If_is_unsigned_integer<unsigned_long> _Var10;
  _If_is_unsigned_integer<unsigned_long> _Var11;
  _If_is_unsigned_integer<unsigned_long> _Var12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  _If_is_unsigned_integer<unsigned_long> _Var16;
  _If_is_unsigned_integer<unsigned_long> _Var17;
  ulong uVar18;
  _If_is_unsigned_integer<unsigned_long> _Var19;
  _If_is_unsigned_integer<unsigned_long> _Var20;
  ulong uVar21;
  ulong uVar22;
  _If_is_unsigned_integer<unsigned_long> _Var23;
  _If_is_unsigned_integer<unsigned_long> _Var24;
  ulong uVar25;
  ulong uVar26;
  _If_is_unsigned_integer<unsigned_long> _Var27;
  _If_is_unsigned_integer<unsigned_long> _Var28;
  ulong uVar29;
  ulong uVar30;
  long *in_RDI;
  long in_FS_OFFSET;
  uint64_t t;
  uint64_t v3;
  uint64_t v2;
  uint64_t v1;
  uint64_t v0;
  undefined8 in_stack_ffffffffffffffc0;
  int __s;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *in_RDI;
  lVar3 = in_RDI[1];
  lVar4 = in_RDI[2];
  __x = in_RDI[4] | (ulong)*(byte *)(in_RDI + 5) << 0x38;
  uVar5 = __x ^ in_RDI[3];
  __s = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  _Var6 = std::rotl<unsigned_long>(__x,__s);
  _Var7 = std::rotl<unsigned_long>(__x,__s);
  uVar5 = uVar5 + lVar4;
  _Var8 = std::rotl<unsigned_long>(__x,__s);
  uVar9 = (uVar5 ^ _Var8) + _Var7;
  _Var7 = std::rotl<unsigned_long>(__x,__s);
  _Var8 = std::rotl<unsigned_long>(__x,__s);
  _Var10 = std::rotl<unsigned_long>(__x,__s);
  _Var11 = std::rotl<unsigned_long>(__x,__s);
  _Var12 = std::rotl<unsigned_long>(__x,__s);
  uVar13 = (uVar9 ^ _Var7) + _Var10;
  _Var7 = std::rotl<unsigned_long>(__x,__s);
  uVar14 = (uVar13 ^ _Var7) + _Var12;
  _Var7 = std::rotl<unsigned_long>(__x,__s);
  _Var10 = std::rotl<unsigned_long>(__x,__s);
  _Var12 = std::rotl<unsigned_long>(__x,__s);
  uVar15 = __x ^ uVar14;
  _Var16 = std::rotl<unsigned_long>(__x,__s);
  _Var17 = std::rotl<unsigned_long>(__x,__s);
  uVar14 = (uVar14 ^ _Var7) + (_Var12 ^ 0xff);
  _Var7 = std::rotl<unsigned_long>(__x,__s);
  uVar18 = (uVar14 ^ _Var7) + _Var17;
  _Var7 = std::rotl<unsigned_long>(__x,__s);
  _Var12 = std::rotl<unsigned_long>(__x,__s);
  _Var17 = std::rotl<unsigned_long>(__x,__s);
  _Var19 = std::rotl<unsigned_long>(__x,__s);
  _Var20 = std::rotl<unsigned_long>(__x,__s);
  uVar21 = (uVar18 ^ _Var7) + _Var17;
  _Var7 = std::rotl<unsigned_long>(__x,__s);
  uVar22 = (uVar21 ^ _Var7) + _Var20;
  _Var7 = std::rotl<unsigned_long>(__x,__s);
  _Var17 = std::rotl<unsigned_long>(__x,__s);
  _Var20 = std::rotl<unsigned_long>(__x,__s);
  _Var23 = std::rotl<unsigned_long>(__x,__s);
  _Var24 = std::rotl<unsigned_long>(__x,__s);
  uVar25 = (uVar22 ^ _Var7) + _Var20;
  _Var7 = std::rotl<unsigned_long>(__x,__s);
  uVar26 = (uVar25 ^ _Var7) + _Var24;
  _Var7 = std::rotl<unsigned_long>(__x,__s);
  _Var20 = std::rotl<unsigned_long>(__x,__s);
  _Var24 = std::rotl<unsigned_long>(__x,__s);
  _Var27 = std::rotl<unsigned_long>(__x,__s);
  _Var28 = std::rotl<unsigned_long>(__x,__s);
  uVar29 = (uVar26 ^ _Var7) + _Var24;
  _Var7 = std::rotl<unsigned_long>(__x,__s);
  uVar30 = (uVar29 ^ _Var7) + _Var28;
  _Var7 = std::rotl<unsigned_long>(__x,__s);
  _Var24 = std::rotl<unsigned_long>(__x,__s);
  _Var28 = std::rotl<unsigned_long>(__x,__s);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar30 ^ (((((((((((lVar3 + lVar2 ^ _Var6) + uVar5 ^ _Var8) + uVar9 ^ _Var11) + uVar13 ^
                           _Var10) + uVar15 ^ _Var16) + uVar14 ^ _Var12) + uVar18 ^ _Var19) + uVar21
                       ^ _Var17) + uVar22 ^ _Var23) + uVar25 ^ _Var20) + uVar26 ^ _Var27) + uVar29 ^
                    _Var24 ^ _Var28 ^ uVar30 ^ _Var7;
  }
  __stack_chk_fail();
}

Assistant:

uint64_t CSipHasher::Finalize() const
{
    uint64_t v0 = v[0], v1 = v[1], v2 = v[2], v3 = v[3];

    uint64_t t = tmp | (((uint64_t)count) << 56);

    v3 ^= t;
    SIPROUND;
    SIPROUND;
    v0 ^= t;
    v2 ^= 0xFF;
    SIPROUND;
    SIPROUND;
    SIPROUND;
    SIPROUND;
    return v0 ^ v1 ^ v2 ^ v3;
}